

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

int Scl_LibertyItemNum(Scl_Tree_t *p,Scl_Item_t *pRoot,char *pName)

{
  int iVar1;
  int local_2c;
  Scl_Item_t *pSStack_28;
  int Counter;
  Scl_Item_t *pItem;
  char *pName_local;
  Scl_Item_t *pRoot_local;
  Scl_Tree_t *p_local;
  
  local_2c = 0;
  for (pSStack_28 = Scl_LibertyItem(p,pRoot->Child); pSStack_28 != (Scl_Item_t *)0x0;
      pSStack_28 = Scl_LibertyItem(p,pSStack_28->Next)) {
    iVar1 = Scl_LibertyCompare(p,pSStack_28->Key,pName);
    if (iVar1 == 0) {
      local_2c = local_2c + 1;
    }
  }
  return local_2c;
}

Assistant:

int Scl_LibertyItemNum( Scl_Tree_t * p, Scl_Item_t * pRoot, char * pName )
{
    Scl_Item_t * pItem;
    int Counter = 0;
    Scl_ItemForEachChildName( p, pRoot, pItem, pName )
        Counter++;
    return Counter;
}